

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFExporter.cpp
# Opt level: O2

void __thiscall Assimp::D3MF::D3MFExporter::writeFaces(D3MFExporter *this,aiMesh *mesh,uint matIdx)

{
  ostream *poVar1;
  ostringstream *poVar2;
  ulong uVar3;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (((mesh != (aiMesh *)0x0) && (mesh->mFaces != (aiFace *)0x0)) && (mesh->mNumFaces != 0)) {
    poVar2 = &this->mModelOutput;
    poVar1 = std::operator<<((ostream *)poVar2,"<");
    poVar1 = std::operator<<(poVar1,(string *)XmlTag::triangles_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,">");
    std::endl<char,std::char_traits<char>>(poVar1);
    for (uVar3 = 0; uVar3 < mesh->mNumFaces; uVar3 = uVar3 + 1) {
      poVar1 = std::operator<<((ostream *)poVar2,"<");
      poVar1 = std::operator<<(poVar1,(string *)XmlTag::triangle_abi_cxx11_);
      poVar1 = std::operator<<(poVar1," v1=\"");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      poVar1 = std::operator<<(poVar1,"\" v2=\"");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      poVar1 = std::operator<<(poVar1,"\" v3=\"");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      to_string<unsigned_int>(&local_90,matIdx);
      std::operator+(&local_70,"\" pid=\"1\" p1=\"",&local_90);
      std::operator+(&local_50,&local_70,"\" />");
      std::operator<<(poVar1,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::endl<char,std::char_traits<char>>((ostream *)poVar2);
    }
    poVar1 = std::operator<<((ostream *)poVar2,"</");
    poVar1 = std::operator<<(poVar1,(string *)XmlTag::triangles_abi_cxx11_);
    std::operator<<(poVar1,">");
    std::endl<char,std::char_traits<char>>((ostream *)poVar2);
  }
  return;
}

Assistant:

void D3MFExporter::writeFaces( aiMesh *mesh, unsigned int matIdx ) {
    if ( nullptr == mesh ) {
        return;
    }

    if ( !mesh->HasFaces() ) {
        return;
    }
    mModelOutput << "<" << XmlTag::triangles << ">" << std::endl;
    for ( unsigned int i = 0; i < mesh->mNumFaces; ++i ) {
        aiFace &currentFace = mesh->mFaces[ i ];
        mModelOutput << "<" << XmlTag::triangle << " v1=\"" << currentFace.mIndices[ 0 ] << "\" v2=\""
                << currentFace.mIndices[ 1 ] << "\" v3=\"" << currentFace.mIndices[ 2 ]
                << "\" pid=\"1\" p1=\""+to_string(matIdx)+"\" />";
        mModelOutput << std::endl;
    }
    mModelOutput << "</" << XmlTag::triangles << ">";
    mModelOutput << std::endl;
}